

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall
QMainWindowLayoutState::restoreState
          (QMainWindowLayoutState *this,QDataStream *_stream,QMainWindowLayoutState *oldState)

{
  QDockAreaLayout *this_00;
  QRect QVar1;
  Data *pDVar2;
  QDockAreaLayoutItem *pQVar3;
  qsizetype qVar4;
  char cVar5;
  bool bVar6;
  QMainWindowLayout *this_01;
  QDockWidgetGroupWindow *this_02;
  QLayout *pQVar7;
  QDockAreaLayoutInfo *this_03;
  QWidget *pQVar8;
  undefined1 auVar9 [8];
  QWidget **ppQVar10;
  QLayoutItem *this_04;
  long in_FS_OFFSET;
  QRect rect;
  uchar marker;
  QList<QDockWidget_*> local_148;
  byte local_129;
  QByteArray local_128;
  QArrayDataPointer<QDockAreaLayoutItem> local_108;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  QWidget **local_d8;
  _func_int **local_c8;
  QRect QStack_c0;
  QMainWindow *pQStack_b0;
  QArrayDataPointer<QDockAreaLayoutItem> local_a8;
  bool local_90;
  undefined7 uStack_8f;
  QTabBar *pQStack_88;
  Int local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128.d.d = (Data *)0x0;
  local_128.d.ptr = (char *)0x0;
  local_128.d.size = 0;
  cVar5 = QDataStream::atEnd();
  if (cVar5 == '\0') {
    do {
      local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      auStack_e0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)local_e8,0x400,'\0');
      if ((local_e8 == (undefined1  [8])0x0) ||
         (1 < (((QArrayData *)local_e8)->ref_)._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)local_e8,(AllocationOption)local_d8);
      }
      QDataStream::readRawData((char *)_stream,(longlong)auStack_e0);
      QByteArray::resize((longlong)local_e8);
      QByteArray::append(&local_128);
      if (local_e8 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8,1,0x10);
        }
      }
      cVar5 = QDataStream::atEnd();
    } while (cVar5 == '\0');
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_128);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,*(undefined4 *)(_stream + 0x18));
  bVar6 = checkFormat(this,(QDataStream *)&local_58);
  if (!bVar6) {
    bVar6 = false;
    goto LAB_004320f3;
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_78,&local_128);
  puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,*(undefined4 *)(_stream + 0x18));
  cVar5 = QDataStream::atEnd();
  bVar6 = true;
  if (cVar5 == '\0') {
    this_00 = &this->dockAreaLayout;
LAB_00431adf:
    local_129 = 0xaa;
    QDataStream::operator>>((QDataStream *)&local_78,&local_129);
    switch(local_129) {
    case 0xf9:
      local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets(&local_148,
                       *(QWidget **)(*(long *)&(this->mainWindow->super_QWidget).field_0x8 + 0x20));
      this_01 = qt_mainwindow_layout(this->mainWindow);
      this_02 = QMainWindowLayout::createTabbedDockWindow((QMainWindowLayout *)this_01);
      QDockAreaLayoutInfo::QDockAreaLayoutInfo
                ((QDockAreaLayoutInfo *)local_e8,&(this->dockAreaLayout).sep,LeftDock,Horizontal,1,
                 this->mainWindow);
      pQVar7 = QWidget::layout(&this_02->super_QWidget);
      pQVar7[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_e8;
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)&pQVar7[4].super_QLayoutItem.align,
                 (QArrayDataPointer<QWidget_*> *)(local_e8 + 8));
      qVar4 = local_a8.size;
      pQVar3 = local_a8.ptr;
      pDVar2 = local_a8.d;
      *(undefined8 *)(pQVar7 + 6) = QStack_c0._8_8_;
      *(QMainWindow **)&pQVar7[6].field_0x8 = pQStack_b0;
      pQVar7[5].super_QLayoutItem._vptr_QLayoutItem = local_c8;
      pQVar7[5].super_QLayoutItem.align = (Alignment)QStack_c0.x1.m_i;
      *(int *)&pQVar7[5].super_QLayoutItem.field_0xc = QStack_c0.y1.m_i;
      local_a8.size = 0;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (QDockAreaLayoutItem *)0x0;
      local_108.d = (Data *)pQVar7[6].super_QLayoutItem._vptr_QLayoutItem;
      local_108.ptr = *(QDockAreaLayoutItem **)&pQVar7[6].super_QLayoutItem.align;
      pQVar7[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pDVar2;
      *(QDockAreaLayoutItem **)&pQVar7[6].super_QLayoutItem.align = pQVar3;
      local_108.size = *(qsizetype *)(pQVar7 + 7);
      *(qsizetype *)(pQVar7 + 7) = qVar4;
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_108);
      pQVar7[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i = local_80;
      pQVar7[7].field_0x8 = local_90;
      *(undefined7 *)&pQVar7[7].field_0x9 = uStack_8f;
      pQVar7[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQStack_88;
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_a8);
      if (auStack_e0 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)auStack_e0)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)auStack_e0)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)auStack_e0)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)auStack_e0,8,0x10);
        }
      }
      _local_e8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      ::operator>>((QDataStream *)&local_78,(QRect *)local_e8);
      pQVar7 = QWidget::layout(&this_02->super_QWidget);
      this_04 = &pQVar7[4].super_QLayoutItem;
      pQVar8 = (QWidget *)0x0;
      bVar6 = QDockAreaLayoutInfo::restoreState
                        ((QDockAreaLayoutInfo *)this_04,(QDataStream *)&local_78,&local_148,false);
      QVar1 = _local_e8;
      if (!bVar6) {
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          auVar9 = (undefined1  [8])local_148.d.d;
          if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
          goto switchD_00431b12_caseD_fa;
          goto LAB_004320d5;
        }
        goto switchD_00431b12_caseD_fa;
      }
      rect._8_8_ = this_02;
      rect.x1.m_i = auStack_e0._0_4_;
      rect.y1.m_i = auStack_e0._4_4_;
      auVar9 = local_e8;
      _local_e8 = QVar1;
      _local_e8 = QDockAreaLayout::constrainedRect((QDockAreaLayout *)auVar9,rect,pQVar8);
      local_108.d = local_e8;
      QWidget::move(&this_02->super_QWidget,(QPoint *)&local_108);
      local_108.d = (Data *)CONCAT44((auStack_e0._4_4_ - local_e8._4_4_) + 1,
                                     (auStack_e0._0_4_ - local_e8._0_4_) + 1);
      QWidget::resize(&this_02->super_QWidget,(QSize *)&local_108);
      bVar6 = QDockAreaLayoutInfo::onlyHasPlaceholders((QDockAreaLayoutInfo *)this_04);
      if (bVar6) {
        QDockAreaLayoutInfo::reparentWidgets((QDockAreaLayoutInfo *)this_04,&this_02->super_QWidget)
        ;
      }
      else {
        QWidget::show(&this_02->super_QWidget);
      }
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,8,0x10);
        }
      }
LAB_00432053:
      cVar5 = QDataStream::atEnd();
      if (cVar5 != '\0') goto LAB_004320a0;
      goto LAB_00431adf;
    default:
      goto switchD_00431b12_caseD_fa;
    case 0xfc:
    case 0xfe:
      local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      auStack_e0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      findChildrenHelper<QToolBar*>
                ((QList<QToolBar_*> *)local_e8,
                 *(QObject **)&(this->mainWindow->super_QWidget).field_0x8);
      bVar6 = QToolBarAreaLayout::restoreState
                        (&this->toolBarAreaLayout,(QDataStream *)&local_78,
                         (QList<QToolBar_*> *)local_e8,local_129,false);
      if (bVar6) {
        if (local_d8 != (QWidget **)0x0) {
          ppQVar10 = (QWidget **)0x0;
          do {
            pQVar8 = *(QWidget **)(&((QArrayData *)auStack_e0)->ref_ + (long)ppQVar10 * 2);
            local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_108.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
            QToolBarAreaLayout::indexOf((QList<int> *)&local_108,&this->toolBarAreaLayout,pQVar8);
            if ((undefined1 *)local_108.size == (undefined1 *)0x0) {
              local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_148.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
              QToolBarAreaLayout::indexOf
                        ((QList<int> *)&local_148,&oldState->toolBarAreaLayout,pQVar8);
              if ((undefined1 *)local_148.d.size != (undefined1 *)0x0) {
                QToolBarAreaLayoutInfo::insertToolBar
                          ((this->toolBarAreaLayout).docks + *(int *)local_148.d.ptr,(QToolBar *)0x0
                           ,(QToolBar *)pQVar8);
              }
              if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,4,0x10);
                }
              }
            }
            if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate(&(local_108.d)->super_QArrayData,4,0x10);
              }
            }
            ppQVar10 = (QWidget **)((long)ppQVar10 + 1);
          } while (ppQVar10 < local_d8);
        }
LAB_0043201d:
        if (local_e8 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8,8,0x10);
          }
        }
        goto LAB_00432053;
      }
      break;
    case 0xfd:
      local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      auStack_e0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets((QList<QDockWidget_*> *)local_e8,
                       *(QWidget **)(*(long *)&(this->mainWindow->super_QWidget).field_0x8 + 0x20));
      bVar6 = QDockAreaLayout::restoreState
                        (this_00,(QDataStream *)&local_78,(QList<QDockWidget_*> *)local_e8,false);
      if (bVar6) {
        if (local_d8 != (QWidget **)0x0) {
          ppQVar10 = (QWidget **)0x0;
          do {
            pQVar8 = *(QWidget **)(&((QArrayData *)auStack_e0)->ref_ + (long)ppQVar10 * 2);
            local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_108.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
            QDockAreaLayout::indexOf((QList<int> *)&local_108,this_00,pQVar8);
            if ((undefined1 *)local_108.size == (undefined1 *)0x0) {
              local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_148.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
              QDockAreaLayout::indexOf((QList<int> *)&local_148,&oldState->dockAreaLayout,pQVar8);
              if (((undefined1 *)local_148.d.size != (undefined1 *)0x0) &&
                 (this_03 = QDockAreaLayout::info(this_00,(QList<int> *)&local_148),
                 this_03 != (QDockAreaLayoutInfo *)0x0)) {
                QDockAreaLayoutInfo::add(this_03,pQVar8);
              }
              if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,4,0x10);
                }
              }
            }
            if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate(&(local_108.d)->super_QArrayData,4,0x10);
              }
            }
            ppQVar10 = (QWidget **)((long)ppQVar10 + 1);
          } while (ppQVar10 < local_d8);
        }
        goto LAB_0043201d;
      }
    }
    if (local_e8 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      auVar9 = local_e8;
      if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
LAB_004320d5:
        QArrayData::deallocate((QArrayData *)auVar9,8,0x10);
      }
    }
switchD_00431b12_caseD_fa:
    bVar6 = false;
  }
LAB_004320e6:
  QDataStream::~QDataStream((QDataStream *)&local_78);
LAB_004320f3:
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
LAB_004320a0:
  bVar6 = true;
  goto LAB_004320e6;
}

Assistant:

bool QMainWindowLayoutState::restoreState(QDataStream &_stream,
                                        const QMainWindowLayoutState &oldState)
{
    //make a copy of the data so that we can read it more than once
    QByteArray copy;
    while(!_stream.atEnd()) {
        int length = 1024;
        QByteArray ba(length, '\0');
        length = _stream.readRawData(ba.data(), ba.size());
        ba.resize(length);
        copy += ba;
    }

    QDataStream ds(copy);
    ds.setVersion(_stream.version());
    if (!checkFormat(ds))
        return false;

    QDataStream stream(copy);
    stream.setVersion(_stream.version());

    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets))
                        return false;

                    for (int i = 0; i < dockWidgets.size(); ++i) {
                        QDockWidget *w = dockWidgets.at(i);
                        QList<int> path = dockAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.dockAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            QDockAreaLayoutInfo *info = dockAreaLayout.info(oldPath);
                            if (info == nullptr) {
                                continue;
                            }
                            info->add(w);
                        }
                    }
                }
                break;
#if QT_CONFIG(tabwidget)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
            {
                auto dockWidgets = allMyDockWidgets(mainWindow);
                QDockWidgetGroupWindow* floatingTab = qt_mainwindow_layout(mainWindow)->createTabbedDockWindow();
                *floatingTab->layoutInfo() = QDockAreaLayoutInfo(
                    &dockAreaLayout.sep, QInternal::LeftDock, // FIXME: DockWidget doesn't save original docking area
                    Qt::Horizontal, QTabBar::RoundedSouth, mainWindow);
                QRect geometry;
                stream >> geometry;
                QDockAreaLayoutInfo *info = floatingTab->layoutInfo();
                if (!info->restoreState(stream, dockWidgets, false))
                    return false;
                geometry = QDockAreaLayout::constrainedRect(geometry, floatingTab);
                floatingTab->move(geometry.topLeft());
                floatingTab->resize(geometry.size());

                // Don't show an empty QDockWidgetGroupWindow if no dock widget is available yet.
                // reparentWidgets() would be triggered by show(), so do it explicitly here.
                if (info->onlyHasPlaceholders())
                    info->reparentWidgets(floatingTab);
                else
                    floatingTab->show();
            }
            break;
#endif // QT_CONFIG(tabwidget)
#endif // QT_CONFIG(dockwidget)

#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker))
                        return false;

                    for (int i = 0; i < toolBars.size(); ++i) {
                        QToolBar *w = toolBars.at(i);
                        QList<int> path = toolBarAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.toolBarAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            toolBarAreaLayout.docks[oldPath.at(0)].insertToolBar(nullptr, w);
                        }
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)
            default:
                return false;
        }// switch
    } //while


    return true;
}